

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O1

bool google::InitVLOG3__(int32 **site_flag,int32 *site_default,char *fname,int32 verbose_level)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *pcVar6;
  string *psVar7;
  string *psVar8;
  string *psVar9;
  size_t str_len;
  MutexLock l;
  string pattern;
  undefined4 local_74;
  MutexLock local_70;
  char *local_68;
  string *local_60;
  int32 **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_70.mu_ = (Mutex *)vmodule_lock;
  if ((vmodule_lock[0x38] == '\x01') &&
     (iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)vmodule_lock), iVar3 != 0)) {
    abort();
  }
  cVar1 = inited_vmodule;
  if (inited_vmodule == '\0') {
    inited_vmodule = 0;
    pcVar6 = (char *)*fLS::FLAGS_vmodule_abi_cxx11_;
    psVar7 = (string *)0x0;
    psVar9 = (string *)0x0;
    local_68 = fname;
    local_60 = (string *)site_default;
    local_58 = site_flag;
    do {
      pcVar4 = strchr(pcVar6,0x3d);
      psVar8 = psVar7;
      psVar5 = psVar9;
      if (pcVar4 == (char *)0x0) break;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar6,pcVar4);
      iVar3 = __isoc99_sscanf(pcVar4,"=%d",&local_74);
      if (iVar3 == 1) {
        psVar5 = (string *)operator_new(0x30);
        *(string **)psVar5 = psVar5 + 0x10;
        *(undefined8 *)(psVar5 + 8) = 0;
        psVar5[0x10] = (string)0x0;
        std::__cxx11::string::_M_assign(psVar5);
        *(undefined4 *)(psVar5 + 0x20) = local_74;
        psVar8 = psVar5;
        if (psVar7 != (string *)0x0) {
          *(string **)(psVar9 + 0x28) = psVar5;
          psVar8 = psVar7;
        }
      }
      pcVar4 = strchr(pcVar4,0x2c);
      pcVar6 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      psVar7 = psVar8;
      psVar9 = psVar5;
    } while (pcVar4 != (char *)0x0);
    if (psVar8 != (string *)0x0) {
      *(string **)(psVar5 + 0x28) = vmodule_list;
      vmodule_list = psVar8;
    }
    inited_vmodule = '\x01';
    site_flag = local_58;
    site_default = (int32 *)local_60;
    fname = local_68;
  }
  pcVar4 = strrchr(fname,0x2f);
  pcVar6 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar6 = fname;
  }
  pcVar4 = strchr(pcVar6,0x2e);
  if (pcVar4 == (char *)0x0) {
    str_len = strlen(pcVar6);
  }
  else {
    str_len = (long)pcVar4 - (long)pcVar6;
  }
  psVar7 = vmodule_list;
  if ((3 < str_len) && (*(int *)(pcVar6 + (str_len - 4)) == 0x6c6e692d)) {
    str_len = str_len - 4;
  }
  do {
    if (psVar7 == (string *)0x0) {
LAB_00116aa5:
      if (cVar1 != '\0') {
        *site_flag = site_default;
      }
      iVar3 = *site_default;
      ::glog_internal_namespace_::MutexLock::~MutexLock(&local_70);
      return verbose_level <= iVar3;
    }
    bVar2 = glog_internal_namespace_::SafeFNMatch_
                      (*(char **)psVar7,*(size_t *)(psVar7 + 8),pcVar6,str_len);
    if (bVar2) {
      site_default = (int32 *)(psVar7 + 0x20);
      goto LAB_00116aa5;
    }
    psVar7 = *(string **)(psVar7 + 0x28);
  } while( true );
}

Assistant:

bool InitVLOG3__(int32** site_flag, int32* site_default,
                 const char* fname, int32 verbose_level) {
  MutexLock l(&vmodule_lock);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = site_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');
  base = base ? (base+1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length = base_end ? size_t(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base+base_length-4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list;
       info != NULL; info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
        // value at info->vlog_level is now what controls
        // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) *site_flag = site_flag_value;

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}